

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption
          (OptionInterpreter *this,Message *options,vector<int,_std::allocator<int>_> *src_path,
          vector<int,_std::allocator<int>_> *options_path)

{
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *this_00;
  DescriptorBuilder *this_01;
  pointer ppFVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CppType CVar5;
  Type TVar6;
  UninterpretedOption_NamePart *pUVar7;
  string *psVar8;
  Descriptor *pDVar9;
  long lVar10;
  ulong uVar11;
  Reflection *pRVar12;
  UnknownFieldSet *pUVar13;
  pointer pUVar14;
  reference ppFVar15;
  LogMessage *pLVar16;
  type pUVar17;
  mapped_type *pmVar18;
  mapped_type *this_02;
  byte local_5e2;
  int local_510;
  LogFinisher local_509;
  int index;
  LogFinisher local_4ca;
  byte local_4c9;
  LogMessage local_4c8;
  undefined1 local_490 [8];
  CodedOutputStream out;
  StringOutputStream outstr;
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  parent_unknown_fields;
  undefined1 local_420 [8];
  reverse_iterator iter;
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  unknown_fields;
  const_iterator local_408;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  local_400;
  const_iterator local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  int local_36c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  int local_1a4;
  SymbolBase *local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string *local_158;
  string *name_part;
  undefined1 local_148 [4];
  int i;
  vector<int,_std::allocator<int>_> dest_path;
  undefined1 local_128 [8];
  string debug_msg_name;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  intermediate_fields;
  FieldDescriptor *field;
  Descriptor *descriptor;
  LogMessage local_d8;
  Symbol local_a0;
  Symbol symbol;
  Descriptor *options_descriptor;
  string local_88;
  allocator local_51;
  string local_50;
  vector<int,_std::allocator<int>_> *local_30;
  vector<int,_std::allocator<int>_> *options_path_local;
  vector<int,_std::allocator<int>_> *src_path_local;
  Message *options_local;
  OptionInterpreter *this_local;
  
  local_30 = options_path;
  options_path_local = src_path;
  src_path_local = (vector<int,_std::allocator<int>_> *)options;
  options_local = (Message *)this;
  iVar3 = UninterpretedOption::name_size(this->uninterpreted_option_);
  if (iVar3 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"Option must have a name.",&local_51);
    this_local._7_1_ = AddNameError(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  else {
    pUVar7 = UninterpretedOption::name(this->uninterpreted_option_,0);
    psVar8 = UninterpretedOption_NamePart::name_part_abi_cxx11_(pUVar7);
    bVar2 = std::operator==(psVar8,"uninterpreted_option");
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_88,"Option must not use reserved name \"uninterpreted_option\".",
                 (allocator *)((long)&options_descriptor + 7));
      this_local._7_1_ = AddNameError(this,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)((long)&options_descriptor + 7));
    }
    else {
      symbol.ptr_ = (SymbolBase *)0x0;
      this_01 = this->builder_;
      pDVar9 = Message::GetDescriptor((Message *)src_path_local);
      psVar8 = Descriptor::full_name_abi_cxx11_(pDVar9);
      local_a0 = FindSymbolNotEnforcingDeps(this_01,psVar8,true);
      symbol.ptr_ = (SymbolBase *)Symbol::descriptor(&local_a0);
      if ((Descriptor *)symbol.ptr_ == (Descriptor *)0x0) {
        symbol.ptr_ = (SymbolBase *)Message::GetDescriptor((Message *)src_path_local);
      }
      descriptor._7_1_ = 0;
      if (symbol.ptr_ == (SymbolBase *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                   ,0x1bb0);
        descriptor._7_1_ = 1;
        pLVar16 = internal::LogMessage::operator<<(&local_d8,"CHECK failed: options_descriptor: ");
        internal::LogFinisher::operator=((LogFinisher *)((long)&descriptor + 6),pLVar16);
      }
      if ((descriptor._7_1_ & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_d8);
      }
      field = (FieldDescriptor *)symbol.ptr_;
      intermediate_fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)((long)&debug_msg_name.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_128,"",
                 (allocator *)
                 ((long)&dest_path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&dest_path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_148,local_30);
      for (name_part._4_4_ = 0; iVar3 = name_part._4_4_,
          iVar4 = UninterpretedOption::name_size(this->uninterpreted_option_), iVar3 < iVar4;
          name_part._4_4_ = name_part._4_4_ + 1) {
        std::__cxx11::string::clear();
        pUVar7 = UninterpretedOption::name(this->uninterpreted_option_,name_part._4_4_);
        local_158 = UninterpretedOption_NamePart::name_part_abi_cxx11_(pUVar7);
        lVar10 = std::__cxx11::string::size();
        if (lVar10 != 0) {
          std::__cxx11::string::operator+=((string *)local_128,".");
        }
        pUVar7 = UninterpretedOption::name(this->uninterpreted_option_,name_part._4_4_);
        bVar2 = UninterpretedOption_NamePart::is_extension(pUVar7);
        if (bVar2) {
          std::operator+(&local_198,"(",local_158);
          std::operator+(&local_178,&local_198,")");
          std::__cxx11::string::operator+=((string *)local_128,(string *)&local_178);
          std::__cxx11::string::~string((string *)&local_178);
          std::__cxx11::string::~string((string *)&local_198);
          local_1a0 = (SymbolBase *)
                      LookupSymbol(this->builder_,local_158,&this->options_to_interpret_->name_scope
                                   ,PLACEHOLDER_MESSAGE,LOOKUP_ALL,true);
          local_a0 = (Symbol)local_1a0;
          intermediate_fields.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)Symbol::field_descriptor(&local_a0);
        }
        else {
          std::__cxx11::string::operator+=((string *)local_128,(string *)local_158);
          intermediate_fields.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)Descriptor::FindFieldByName((Descriptor *)field,local_158);
        }
        if (intermediate_fields.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
          bVar2 = get_allow_unknown(this->builder_->pool_);
          if (bVar2) {
            AddWithoutInterpreting(this,this->uninterpreted_option_,(Message *)src_path_local);
            this_local._7_1_ = 1;
            local_1a4 = 1;
          }
          else {
            uVar11 = std::__cxx11::string::empty();
            if ((uVar11 & 1) == 0) {
              std::operator+(&local_268,"Option \"",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_128);
              std::operator+(&local_248,&local_268,"\" is resolved to \"(");
              std::operator+(&local_228,&local_248,&this->builder_->undefine_resolved_name_);
              std::operator+(&local_208,&local_228,
                             ")\", which is not defined. The innermost scope is searched first in name resolution. Consider using a leading \'.\'(i.e., \"(."
                            );
              std::__cxx11::string::substr((ulong)&local_288,(ulong)local_128);
              std::operator+(&local_1e8,&local_208,&local_288);
              std::operator+(&local_1c8,&local_1e8,"\") to start from the outermost scope.");
              this_local._7_1_ = AddNameError(this,&local_1c8);
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::~string((string *)&local_1e8);
              std::__cxx11::string::~string((string *)&local_288);
              std::__cxx11::string::~string((string *)&local_208);
              std::__cxx11::string::~string((string *)&local_228);
              std::__cxx11::string::~string((string *)&local_248);
              std::__cxx11::string::~string((string *)&local_268);
              local_1a4 = 1;
            }
            else {
              std::operator+(&local_2e8,"Option \"",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_128);
              std::operator+(&local_2c8,&local_2e8,"\" unknown. Ensure that your proto");
              std::operator+(&local_2a8,&local_2c8,
                             " definition file imports the proto which defines the option.");
              this_local._7_1_ = AddNameError(this,&local_2a8);
              std::__cxx11::string::~string((string *)&local_2a8);
              std::__cxx11::string::~string((string *)&local_2c8);
              std::__cxx11::string::~string((string *)&local_2e8);
              local_1a4 = 1;
            }
          }
          goto LAB_00668c58;
        }
        pDVar9 = FieldDescriptor::containing_type
                           ((FieldDescriptor *)
                            intermediate_fields.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (pDVar9 != (Descriptor *)field) {
          pDVar9 = FieldDescriptor::containing_type
                             ((FieldDescriptor *)
                              intermediate_fields.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar2 = get_is_placeholder(pDVar9);
          if (bVar2) {
            AddWithoutInterpreting(this,this->uninterpreted_option_,(Message *)src_path_local);
            this_local._7_1_ = 1;
            local_1a4 = 1;
          }
          else {
            std::operator+(&local_368,"Option field \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_128);
            std::operator+(&local_348,&local_368,"\" is not a field or extension of message \"");
            psVar8 = Descriptor::name_abi_cxx11_((Descriptor *)field);
            std::operator+(&local_328,&local_348,psVar8);
            std::operator+(&local_308,&local_328,"\".");
            this_local._7_1_ = AddNameError(this,&local_308);
            std::__cxx11::string::~string((string *)&local_308);
            std::__cxx11::string::~string((string *)&local_328);
            std::__cxx11::string::~string((string *)&local_348);
            std::__cxx11::string::~string((string *)&local_368);
            local_1a4 = 1;
          }
          goto LAB_00668c58;
        }
        local_36c = FieldDescriptor::number
                              ((FieldDescriptor *)
                               intermediate_fields.
                               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_148,&local_36c);
        iVar3 = name_part._4_4_;
        iVar4 = UninterpretedOption::name_size(this->uninterpreted_option_);
        if (iVar3 < iVar4 + -1) {
          CVar5 = FieldDescriptor::cpp_type
                            ((FieldDescriptor *)
                             intermediate_fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (CVar5 != CPPTYPE_MESSAGE) {
            std::operator+(&local_3b0,"Option \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_128);
            std::operator+(&local_390,&local_3b0,"\" is an atomic type, not a message.");
            this_local._7_1_ = AddNameError(this,&local_390);
            std::__cxx11::string::~string((string *)&local_390);
            std::__cxx11::string::~string((string *)&local_3b0);
            local_1a4 = 1;
            goto LAB_00668c58;
          }
          bVar2 = FieldDescriptor::is_repeated
                            ((FieldDescriptor *)
                             intermediate_fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar2) {
            std::operator+(&local_3f0,"Option field \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_128);
            std::operator+(&local_3d0,&local_3f0,
                           "\" is a repeated message. Repeated message options must be initialized using an aggregate value."
                          );
            this_local._7_1_ = AddNameError(this,&local_3d0);
            std::__cxx11::string::~string((string *)&local_3d0);
            std::__cxx11::string::~string((string *)&local_3f0);
            local_1a4 = 1;
            goto LAB_00668c58;
          }
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       *)((long)&debug_msg_name.field_2 + 8),
                      (value_type *)
                      &intermediate_fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          field = (FieldDescriptor *)
                  FieldDescriptor::message_type
                            ((FieldDescriptor *)
                             intermediate_fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
      bVar2 = FieldDescriptor::is_repeated
                        ((FieldDescriptor *)
                         intermediate_fields.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_5e2 = 0;
      if (!bVar2) {
        this_00 = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)((long)&debug_msg_name.field_2 + 8);
        local_400._M_current =
             (FieldDescriptor **)
             std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::begin(this_00);
        __gnu_cxx::
        __normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>
        ::__normal_iterator<google::protobuf::FieldDescriptor_const**>
                  ((__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>
                    *)&local_3f8,&local_400);
        unknown_fields._M_t.
        super___uniq_ptr_impl<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::UnknownFieldSet_*,_std::default_delete<google::protobuf::UnknownFieldSet>_>
        .super__Head_base<0UL,_google::protobuf::UnknownFieldSet_*,_false>._M_head_impl =
             (__uniq_ptr_data<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>,_true,_true>
              )std::
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::end(this_00);
        __gnu_cxx::
        __normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>
        ::__normal_iterator<google::protobuf::FieldDescriptor_const**>
                  ((__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>
                    *)&local_408,
                   (__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                    *)&unknown_fields);
        ppFVar1 = intermediate_fields.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pRVar12 = Message::GetReflection((Message *)src_path_local);
        pUVar13 = Reflection::GetUnknownFields(pRVar12,(Message *)src_path_local);
        bVar2 = ExamineIfOptionIsSet
                          (this,local_3f8,local_408,(FieldDescriptor *)ppFVar1,(string *)local_128,
                           pUVar13);
        local_5e2 = bVar2 ^ 0xff;
      }
      if ((local_5e2 & 1) == 0) {
        pUVar13 = (UnknownFieldSet *)operator_new(0x18);
        UnknownFieldSet::UnknownFieldSet(pUVar13);
        std::
        unique_ptr<google::protobuf::UnknownFieldSet,std::default_delete<google::protobuf::UnknownFieldSet>>
        ::unique_ptr<std::default_delete<google::protobuf::UnknownFieldSet>,void>
                  ((unique_ptr<google::protobuf::UnknownFieldSet,std::default_delete<google::protobuf::UnknownFieldSet>>
                    *)&iter,pUVar13);
        ppFVar1 = intermediate_fields.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pUVar14 = std::
                  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                  ::get((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                         *)&iter);
        bVar2 = SetOptionValue(this,(FieldDescriptor *)ppFVar1,pUVar14);
        if (bVar2) {
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::rbegin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)local_420);
          while( true ) {
            std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::rend((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)&parent_unknown_fields);
            bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                     *)local_420,
                                    (reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                     *)&parent_unknown_fields);
            if (!bVar2) break;
            pUVar13 = (UnknownFieldSet *)operator_new(0x18);
            UnknownFieldSet::UnknownFieldSet(pUVar13);
            std::
            unique_ptr<google::protobuf::UnknownFieldSet,std::default_delete<google::protobuf::UnknownFieldSet>>
            ::unique_ptr<std::default_delete<google::protobuf::UnknownFieldSet>,void>
                      ((unique_ptr<google::protobuf::UnknownFieldSet,std::default_delete<google::protobuf::UnknownFieldSet>>
                        *)&outstr.target_,pUVar13);
            ppFVar15 = std::
                       reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                       ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                    *)local_420);
            TVar6 = FieldDescriptor::type(*ppFVar15);
            if (TVar6 == TYPE_GROUP) {
              pUVar14 = std::
                        unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                        ::operator->((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                                      *)&outstr.target_);
              ppFVar15 = std::
                         reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                         ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                      *)local_420);
              iVar3 = FieldDescriptor::number(*ppFVar15);
              pUVar13 = UnknownFieldSet::AddGroup(pUVar14,iVar3);
              pUVar17 = std::
                        unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                        ::operator*((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                                     *)&iter);
              UnknownFieldSet::MergeFrom(pUVar13,pUVar17);
LAB_00668ad4:
              pUVar14 = std::
                        unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                        ::release((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                                   *)&outstr.target_);
              std::
              unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
              ::reset((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                       *)&iter,pUVar14);
              local_1a4 = 0;
            }
            else {
              if (TVar6 == TYPE_MESSAGE) {
                pUVar14 = std::
                          unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                          ::operator->((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                                        *)&outstr.target_);
                ppFVar15 = std::
                           reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                           ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                        *)local_420);
                iVar3 = FieldDescriptor::number(*ppFVar15);
                psVar8 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(pUVar14,iVar3);
                io::StringOutputStream::StringOutputStream
                          ((StringOutputStream *)&out.start_count_,psVar8);
                io::CodedOutputStream::CodedOutputStream
                          ((CodedOutputStream *)local_490,(ZeroCopyOutputStream *)&out.start_count_)
                ;
                pUVar17 = std::
                          unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                          ::operator*((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                                       *)&iter);
                internal::WireFormat::SerializeUnknownFields(pUVar17,(CodedOutputStream *)local_490)
                ;
                local_4c9 = 0;
                bVar2 = io::CodedOutputStream::HadError((CodedOutputStream *)local_490);
                if (bVar2) {
                  internal::LogMessage::LogMessage
                            (&local_4c8,LOGLEVEL_DFATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                             ,0x1c39);
                  local_4c9 = 1;
                  pLVar16 = internal::LogMessage::operator<<
                                      (&local_4c8,"CHECK failed: !out.HadError(): ");
                  pLVar16 = internal::LogMessage::operator<<
                                      (pLVar16,
                                       "Unexpected failure while serializing option submessage ");
                  pLVar16 = internal::LogMessage::operator<<(pLVar16,(string *)local_128);
                  pLVar16 = internal::LogMessage::operator<<(pLVar16,"\".");
                  internal::LogFinisher::operator=(&local_4ca,pLVar16);
                }
                if ((local_4c9 & 1) != 0) {
                  internal::LogMessage::~LogMessage(&local_4c8);
                }
                local_1a4 = 8;
                io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_490);
                io::StringOutputStream::~StringOutputStream((StringOutputStream *)&out.start_count_)
                ;
                goto LAB_00668ad4;
              }
              internal::LogMessage::LogMessage
                        ((LogMessage *)&index,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                         ,0x1c46);
              pLVar16 = internal::LogMessage::operator<<
                                  ((LogMessage *)&index,"Invalid wire type for CPPTYPE_MESSAGE: ");
              ppFVar15 = std::
                         reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                         ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                                      *)local_420);
              TVar6 = FieldDescriptor::type(*ppFVar15);
              pLVar16 = internal::LogMessage::operator<<(pLVar16,TVar6);
              internal::LogFinisher::operator=(&local_509,pLVar16);
              internal::LogMessage::~LogMessage((LogMessage *)&index);
              this_local._7_1_ = 0;
              local_1a4 = 1;
            }
            std::
            unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
            ::~unique_ptr((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                           *)&outstr.target_);
            if (local_1a4 != 0) goto LAB_00668c3c;
            std::
            reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
            ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                          *)local_420);
          }
          pRVar12 = Message::GetReflection((Message *)src_path_local);
          pUVar13 = Reflection::MutableUnknownFields(pRVar12,(Message *)src_path_local);
          pUVar17 = std::
                    unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                    ::operator*((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                                 *)&iter);
          UnknownFieldSet::MergeFrom(pUVar13,pUVar17);
          bVar2 = FieldDescriptor::is_repeated
                            ((FieldDescriptor *)
                             intermediate_fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar2) {
            pmVar18 = std::
                      map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                      ::operator[](&this->repeated_option_counts_,(key_type *)local_148);
            local_510 = *pmVar18;
            *pmVar18 = local_510 + 1;
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)local_148,&local_510);
          }
          this_02 = std::
                    map<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[](&this->interpreted_paths_,options_path_local);
          std::vector<int,_std::allocator<int>_>::operator=
                    (this_02,(vector<int,_std::allocator<int>_> *)local_148);
          this_local._7_1_ = 1;
          local_1a4 = 1;
        }
        else {
          this_local._7_1_ = 0;
          local_1a4 = 1;
        }
LAB_00668c3c:
        std::
        unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
        ::~unique_ptr((unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
                       *)&iter);
      }
      else {
        this_local._7_1_ = 0;
        local_1a4 = 1;
      }
LAB_00668c58:
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_148);
      std::__cxx11::string::~string((string *)local_128);
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)((long)&debug_msg_name.field_2 + 8));
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::InterpretSingleOption(
    Message* options, const std::vector<int>& src_path,
    const std::vector<int>& options_path) {
  // First do some basic validation.
  if (uninterpreted_option_->name_size() == 0) {
    // This should never happen unless the parser has gone seriously awry or
    // someone has manually created the uninterpreted option badly.
    return AddNameError("Option must have a name.");
  }
  if (uninterpreted_option_->name(0).name_part() == "uninterpreted_option") {
    return AddNameError(
        "Option must not use reserved name "
        "\"uninterpreted_option\".");
  }

  const Descriptor* options_descriptor = nullptr;
  // Get the options message's descriptor from the builder's pool, so that we
  // get the version that knows about any extension options declared in the file
  // we're currently building. The descriptor should be there as long as the
  // file we're building imported descriptor.proto.

  // Note that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
  // DescriptorPool::FindMessageTypeByName() because we're already holding the
  // pool's mutex, and the latter method locks it again.  We don't use
  // FindSymbol() because files that use custom options only need to depend on
  // the file that defines the option, not descriptor.proto itself.
  Symbol symbol = builder_->FindSymbolNotEnforcingDeps(
      options->GetDescriptor()->full_name());
  options_descriptor = symbol.descriptor();
  if (options_descriptor == nullptr) {
    // The options message's descriptor was not in the builder's pool, so use
    // the standard version from the generated pool. We're not holding the
    // generated pool's mutex, so we can search it the straightforward way.
    options_descriptor = options->GetDescriptor();
  }
  GOOGLE_CHECK(options_descriptor);

  // We iterate over the name parts to drill into the submessages until we find
  // the leaf field for the option. As we drill down we remember the current
  // submessage's descriptor in |descriptor| and the next field in that
  // submessage in |field|. We also track the fields we're drilling down
  // through in |intermediate_fields|. As we go, we reconstruct the full option
  // name in |debug_msg_name|, for use in error messages.
  const Descriptor* descriptor = options_descriptor;
  const FieldDescriptor* field = nullptr;
  std::vector<const FieldDescriptor*> intermediate_fields;
  std::string debug_msg_name = "";

  std::vector<int> dest_path = options_path;

  for (int i = 0; i < uninterpreted_option_->name_size(); ++i) {
    builder_->undefine_resolved_name_.clear();
    const std::string& name_part = uninterpreted_option_->name(i).name_part();
    if (debug_msg_name.size() > 0) {
      debug_msg_name += ".";
    }
    if (uninterpreted_option_->name(i).is_extension()) {
      debug_msg_name += "(" + name_part + ")";
      // Search for the extension's descriptor as an extension in the builder's
      // pool. Note that we use DescriptorBuilder::LookupSymbol(), not
      // DescriptorPool::FindExtensionByName(), for two reasons: 1) It allows
      // relative lookups, and 2) because we're already holding the pool's
      // mutex, and the latter method locks it again.
      symbol =
          builder_->LookupSymbol(name_part, options_to_interpret_->name_scope);
      field = symbol.field_descriptor();
      // If we don't find the field then the field's descriptor was not in the
      // builder's pool, but there's no point in looking in the generated
      // pool. We require that you import the file that defines any extensions
      // you use, so they must be present in the builder's pool.
    } else {
      debug_msg_name += name_part;
      // Search for the field's descriptor as a regular field.
      field = descriptor->FindFieldByName(name_part);
    }

    if (field == nullptr) {
      if (get_allow_unknown(builder_->pool_)) {
        // We can't find the option, but AllowUnknownDependencies() is enabled,
        // so we will just leave it as uninterpreted.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else if (!(builder_->undefine_resolved_name_).empty()) {
        // Option is resolved to a name which is not defined.
        return AddNameError(
            "Option \"" + debug_msg_name + "\" is resolved to \"(" +
            builder_->undefine_resolved_name_ +
            ")\", which is not defined. The innermost scope is searched first "
            "in name resolution. Consider using a leading '.'(i.e., \"(." +
            debug_msg_name.substr(1) +
            "\") to start from the outermost scope.");
      } else {
        return AddNameError(
            "Option \"" + debug_msg_name +
            "\" unknown. Ensure that your proto" +
            " definition file imports the proto which defines the option.");
      }
    } else if (field->containing_type() != descriptor) {
      if (get_is_placeholder(field->containing_type())) {
        // The field is an extension of a placeholder type, so we can't
        // reliably verify whether it is a valid extension to use here (e.g.
        // we don't know if it is an extension of the correct *Options message,
        // or if it has a valid field number, etc.).  Just leave it as
        // uninterpreted instead.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else {
        // This can only happen if, due to some insane misconfiguration of the
        // pools, we find the options message in one pool but the field in
        // another. This would probably imply a hefty bug somewhere.
        return AddNameError("Option field \"" + debug_msg_name +
                            "\" is not a field or extension of message \"" +
                            descriptor->name() + "\".");
      }
    } else {
      // accumulate field numbers to form path to interpreted option
      dest_path.push_back(field->number());

      if (i < uninterpreted_option_->name_size() - 1) {
        if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
          return AddNameError("Option \"" + debug_msg_name +
                              "\" is an atomic type, not a message.");
        } else if (field->is_repeated()) {
          return AddNameError("Option field \"" + debug_msg_name +
                              "\" is a repeated message. Repeated message "
                              "options must be initialized using an "
                              "aggregate value.");
        } else {
          // Drill down into the submessage.
          intermediate_fields.push_back(field);
          descriptor = field->message_type();
        }
      }
    }
  }

  // We've found the leaf field. Now we use UnknownFieldSets to set its value
  // on the options message. We do so because the message may not yet know
  // about its extension fields, so we may not be able to set the fields
  // directly. But the UnknownFieldSets will serialize to the same wire-format
  // message, so reading that message back in once the extension fields are
  // known will populate them correctly.

  // First see if the option is already set.
  if (!field->is_repeated() &&
      !ExamineIfOptionIsSet(
          intermediate_fields.begin(), intermediate_fields.end(), field,
          debug_msg_name,
          options->GetReflection()->GetUnknownFields(*options))) {
    return false;  // ExamineIfOptionIsSet() already added the error.
  }

  // First set the value on the UnknownFieldSet corresponding to the
  // innermost message.
  std::unique_ptr<UnknownFieldSet> unknown_fields(new UnknownFieldSet());
  if (!SetOptionValue(field, unknown_fields.get())) {
    return false;  // SetOptionValue() already added the error.
  }

  // Now wrap the UnknownFieldSet with UnknownFieldSets corresponding to all
  // the intermediate messages.
  for (std::vector<const FieldDescriptor*>::reverse_iterator iter =
           intermediate_fields.rbegin();
       iter != intermediate_fields.rend(); ++iter) {
    std::unique_ptr<UnknownFieldSet> parent_unknown_fields(
        new UnknownFieldSet());
    switch ((*iter)->type()) {
      case FieldDescriptor::TYPE_MESSAGE: {
        io::StringOutputStream outstr(
            parent_unknown_fields->AddLengthDelimited((*iter)->number()));
        io::CodedOutputStream out(&outstr);
        internal::WireFormat::SerializeUnknownFields(*unknown_fields, &out);
        GOOGLE_CHECK(!out.HadError())
            << "Unexpected failure while serializing option submessage "
            << debug_msg_name << "\".";
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        parent_unknown_fields->AddGroup((*iter)->number())
            ->MergeFrom(*unknown_fields);
        break;
      }

      default:
        GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: "
                   << (*iter)->type();
        return false;
    }
    unknown_fields.reset(parent_unknown_fields.release());
  }

  // Now merge the UnknownFieldSet corresponding to the top-level message into
  // the options message.
  options->GetReflection()->MutableUnknownFields(options)->MergeFrom(
      *unknown_fields);

  // record the element path of the interpreted option
  if (field->is_repeated()) {
    int index = repeated_option_counts_[dest_path]++;
    dest_path.push_back(index);
  }
  interpreted_paths_[src_path] = dest_path;

  return true;
}